

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TimeZoneFormat::formatSpecific
          (TimeZoneFormat *this,TimeZone *tz,UTimeZoneNameType stdType,UTimeZoneNameType dstType,
          UDate date,UnicodeString *name,UTimeZoneFormatTimeType *timeType)

{
  TimeZoneNames *pTVar1;
  UBool UVar2;
  int iVar3;
  UTimeZoneFormatTimeType UVar4;
  ConstChar16Ptr local_f0;
  UnicodeString local_e8;
  ConstChar16Ptr local_98;
  UnicodeString local_90;
  char16_t *local_50;
  UChar *canonicalID;
  UBool isDaylight;
  UTimeZoneFormatTimeType *pUStack_40;
  UErrorCode status;
  UTimeZoneFormatTimeType *timeType_local;
  UnicodeString *name_local;
  UDate date_local;
  UTimeZoneNameType dstType_local;
  UTimeZoneNameType stdType_local;
  TimeZone *tz_local;
  TimeZoneFormat *this_local;
  
  pUStack_40 = timeType;
  timeType_local = (UTimeZoneFormatTimeType *)name;
  name_local = (UnicodeString *)date;
  date_local._0_4_ = dstType;
  date_local._4_4_ = stdType;
  _dstType_local = tz;
  tz_local = (TimeZone *)this;
  if (this->fTimeZoneNames == (TimeZoneNames *)0x0) {
    UnicodeString::setToBogus(name);
    this_local = (TimeZoneFormat *)timeType_local;
  }
  else {
    canonicalID._4_4_ = U_ZERO_ERROR;
    iVar3 = (*(tz->super_UObject)._vptr_UObject[10])(date,tz,(long)&canonicalID + 4);
    canonicalID._3_1_ = (char)iVar3;
    local_50 = ZoneMeta::getCanonicalCLDRID(_dstType_local);
    UVar2 = ::U_FAILURE(canonicalID._4_4_);
    if ((UVar2 == '\0') && (local_50 != (char16_t *)0x0)) {
      if (canonicalID._3_1_ == '\0') {
        pTVar1 = this->fTimeZoneNames;
        ConstChar16Ptr::ConstChar16Ptr(&local_f0,local_50);
        UnicodeString::UnicodeString(&local_e8,'\x01',&local_f0,-1);
        (*(pTVar1->super_UObject)._vptr_UObject[0xc])
                  (name_local,pTVar1,&local_e8,(ulong)date_local._4_4_,timeType_local);
        UnicodeString::~UnicodeString(&local_e8);
        ConstChar16Ptr::~ConstChar16Ptr(&local_f0);
      }
      else {
        pTVar1 = this->fTimeZoneNames;
        ConstChar16Ptr::ConstChar16Ptr(&local_98,local_50);
        UnicodeString::UnicodeString(&local_90,'\x01',&local_98,-1);
        (*(pTVar1->super_UObject)._vptr_UObject[0xc])
                  (name_local,pTVar1,&local_90,(ulong)date_local._0_4_,timeType_local);
        UnicodeString::~UnicodeString(&local_90);
        ConstChar16Ptr::~ConstChar16Ptr(&local_98);
      }
      if (pUStack_40 != (UTimeZoneFormatTimeType *)0x0) {
        UVar2 = UnicodeString::isEmpty((UnicodeString *)timeType_local);
        if (UVar2 == '\0') {
          UVar4 = UTZFMT_TIME_TYPE_STANDARD;
          if (canonicalID._3_1_ != '\0') {
            UVar4 = UTZFMT_TIME_TYPE_DAYLIGHT;
          }
          *pUStack_40 = UVar4;
        }
      }
      this_local = (TimeZoneFormat *)timeType_local;
    }
    else {
      UnicodeString::setToBogus((UnicodeString *)timeType_local);
      this_local = (TimeZoneFormat *)timeType_local;
    }
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
TimeZoneFormat::formatSpecific(const TimeZone& tz, UTimeZoneNameType stdType, UTimeZoneNameType dstType,
        UDate date, UnicodeString& name, UTimeZoneFormatTimeType *timeType) const {
    if (fTimeZoneNames == NULL) {
        name.setToBogus();
        return name;
    }

    UErrorCode status = U_ZERO_ERROR;
    UBool isDaylight = tz.inDaylightTime(date, status);
    const UChar* canonicalID = ZoneMeta::getCanonicalCLDRID(tz);

    if (U_FAILURE(status) || canonicalID == NULL) {
        name.setToBogus();
        return name;
    }

    if (isDaylight) {
        fTimeZoneNames->getDisplayName(UnicodeString(TRUE, canonicalID, -1), dstType, date, name);
    } else {
        fTimeZoneNames->getDisplayName(UnicodeString(TRUE, canonicalID, -1), stdType, date, name);
    }

    if (timeType && !name.isEmpty()) {
        *timeType = isDaylight ? UTZFMT_TIME_TYPE_DAYLIGHT : UTZFMT_TIME_TYPE_STANDARD;
    }
    return name;
}